

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

ssize_t __thiscall Directory::read(Directory *this,int __fd,void *__buf,size_t __nbytes)

{
  char *__name;
  uchar uVar1;
  bool bVar2;
  int iVar3;
  char *__pattern;
  int *piVar4;
  dirent *pdVar5;
  size_t sVar6;
  char *__file;
  ssize_t sVar7;
  undefined8 extraout_RAX;
  long lVar8;
  undefined4 in_register_00000034;
  String path;
  stat buff;
  
  if (this->dp == (void *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return 0;
  }
  __pattern = String::operator_cast_to_char_(&this->pattern);
  piVar4 = __errno_location();
  *piVar4 = 0;
  do {
    do {
      do {
        pdVar5 = readdir((DIR *)this->dp);
        if (pdVar5 == (dirent *)0x0) {
          return 0;
        }
        __name = pdVar5->d_name;
      } while ((*__pattern != '\0') && (iVar3 = fnmatch(__pattern,__name,0), iVar3 != 0));
      uVar1 = pdVar5->d_type;
      *(bool *)__buf = uVar1 == '\x04';
    } while ((this->dirsOnly == true) && (uVar1 != '\x04'));
    if (uVar1 != '\x04') {
      if ((uVar1 != '\n') && (uVar1 != '\0')) {
LAB_00112414:
        sVar6 = strlen(__name);
        String::String((String *)&buff,__name,sVar6);
        String::operator=((String *)CONCAT44(in_register_00000034,__fd),(String *)&buff);
        String::~String((String *)&buff);
        return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      String::String(&path,&this->dirpath);
      if (((this->dirpath).data)->len != 0) {
        String::append(&path,'/');
      }
      sVar6 = strlen(__name);
      String::append(&path,__name,sVar6);
      __file = String::operator_cast_to_char_(&path);
      iVar3 = stat(__file,(stat *)&buff);
      if ((iVar3 == 0) && ((buff.st_mode & 0xf000) == 0x4000)) {
        *(undefined1 *)__buf = 1;
LAB_001123a1:
        lVar8 = 0;
        bVar2 = true;
      }
      else {
        if (this->dirsOnly == false) goto LAB_001123a1;
        bVar2 = false;
        lVar8 = 3;
      }
      String::~String(&path);
      if (!bVar2) {
        sVar7 = (*(code *)((long)&DAT_001188a0 + (long)(int)(&DAT_001188a0)[lVar8]))();
        return sVar7;
      }
      if ((*__buf & 1) == 0) goto LAB_00112414;
    }
    if ((*__name != '.') ||
       ((pdVar5->d_name[1] != '\0' && ((pdVar5->d_name[1] != '.' || (pdVar5->d_name[2] != '\0'))))))
    goto LAB_00112414;
  } while( true );
}

Assistant:

bool Directory::read(String& name, bool& isDir)
{
#ifdef _WIN32
  if(!findFile)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }
  for(;;)
  {
    if(bufferedEntry)
      bufferedEntry = false;
    else if(!FindNextFile((HANDLE)findFile, (LPWIN32_FIND_DATA)ffd))
    {
      DWORD lastError = GetLastError();
      FindClose((HANDLE)findFile);
      findFile = INVALID_HANDLE_VALUE;
      SetLastError(lastError);
      return false;
    }
    isDir = (((LPWIN32_FIND_DATA)ffd)->dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) == FILE_ATTRIBUTE_DIRECTORY;
    if(dirsOnly && !isDir)
      continue;
    const char* str = ((LPWIN32_FIND_DATA)ffd)->cFileName;
    if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
      continue;

    if(!pattern.isEmpty())
    {
      struct PatternMatcher
      {
        static bool szWildMatch7(const char* pat, const char* str) {
            const char* s, * p;
            bool star = false;

        loopStart:
            for (s = str, p = pat; *s; ++s, ++p) {
              switch (*p) {
                  case '?':
                    break;
                  case '*':
                    star = true;
                    str = s, pat = p;
                    do { ++pat; } while (*pat == '*');
                    if (!*pat) return true;
                    goto loopStart;
                  default:
                    if (String::toLowerCase(*s) != String::toLowerCase(*p)) goto starCheck;
                    break;
              }
            }
            while (*p == '*') ++p;
            return !*p;
   
        starCheck:
            if (!star) return false;
            str++;
            goto loopStart;
        }
      };

      if(!PatternMatcher::szWildMatch7(pattern, str))
        continue;
    }

    name = String(str, (uint)strlen(str));
    return true;
  }
#else
  if(!dp)
  {
    errno = EINVAL;
    return false;
  }

  const char* pattern = this->pattern;
  errno = 0;
  for(;;)
  {
    struct dirent* dent = readdir((DIR*)dp);
    if(!dent)
      break;
    const char* const str = dent->d_name;
    if(!*pattern || fnmatch(pattern, str, 0) == 0)
    {
      isDir = dent->d_type == DT_DIR;
      if(dirsOnly && !isDir)
        continue;
      if(!isDir && (dent->d_type == DT_LNK || dent->d_type == DT_UNKNOWN))
      {
        String path = dirpath;
        if(!dirpath.isEmpty())
          path.append('/');
        path.append(str, strlen(str));
        struct stat buff;
        if(stat(path, &buff) == 0 && S_ISDIR(buff.st_mode))
          isDir = true;
        else if(dirsOnly)
          continue;
      }
      if(isDir && *str == '.' && (str[1] == '\0' || (str[1] == '.' && str[2] == '\0')))
        continue;
      name = String(str, strlen(str));
      return true;
    }
  }
  return false;
#endif
}